

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O2

int __thiscall Conn::do_send(Conn *this,ConnInfo *conn_info)

{
  FILE *__stream;
  ssize_t sVar1;
  int *piVar2;
  Buff *pBVar3;
  char *pcVar4;
  Buff *pBVar5;
  size_t __n;
  uint uVar6;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 uVar7;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  pcVar4 = (conn_info->buf)._w_pos;
  __n = (long)(conn_info->buf)._r_pos - (long)pcVar4;
  if (__n == 0) {
    uVar6 = 0;
  }
  else {
    sVar1 = write(conn_info->fd,pcVar4,__n);
    uVar6 = (uint)sVar1;
    if ((int)uVar6 < 0) {
      piVar2 = __errno_location();
      __stream = _stderr;
      if (*piVar2 == 0xb) {
        return 0;
      }
      uVar6 = conn_info->fd;
      pcVar4 = strerror(*piVar2);
      fprintf(__stream,"%s(%d)-<%s>: send fd: %d occurs error, error: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp"
              ,0xa9,"do_send",(ulong)uVar6,pcVar4);
      fflush(_stderr);
      exit(-5);
    }
  }
  fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbytes: %d\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp",
          0xaf,"do_send",(ulong)(uint)conn_info->fd,CONCAT44(uVar7,uVar6));
  fflush(_stderr);
  pBVar3 = (Buff *)((conn_info->buf)._w_pos + uVar6);
  (conn_info->buf)._w_pos = (char *)pBVar3;
  pBVar5 = (Buff *)(conn_info->buf)._r_pos;
  if (pBVar5 == pBVar3) {
    pBVar3 = &conn_info->buf;
    (conn_info->buf)._r_pos = pBVar3->_buf;
    (conn_info->buf)._w_pos = pBVar3->_buf;
    pBVar5 = pBVar3;
  }
  if ((conn_info->readeof == true) && (pBVar5 == pBVar3)) {
    return -4;
  }
  return 0;
}

Assistant:

int Conn::do_send(ConnInfo *conn_info)
{
    Buff &buf = conn_info->buf;
    int nsend = 0;

    if (buf.data_size() > 0)
    {
        nsend = write(conn_info->fd, buf._w_pos, buf.data_size());
    }
    
    if (nsend < 0)
    {
        if (errno != EAGAIN)
        {
            LOG_PRINT("send fd: %d occurs error, error: %s", conn_info->fd, strerror(errno));
            exit(err_svr_send_error);
        }
    }
    else
    {
        LOG_PRINT("send fd: %d done, total nbytes: %d", conn_info->fd, nsend);
        buf.set_w_pos(nsend);
        if (conn_info->readeof && buf.data_size() == 0)
        {
            return err_svr_send_disconn;
        }
    }

    return err_svr_send_normal;
}